

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

thread_pool * new_thread_pool(size_t thread_count)

{
  cnd_t *pcVar1;
  cnd_t *pcVar2;
  int iVar3;
  thread_pool *thread_pool;
  thread_data *ptVar4;
  thrd_t *ptVar5;
  size_t i;
  size_t sVar6;
  long lVar7;
  long lVar8;
  work_queue *queue;
  
  if (thread_count == 0) {
    __assert_fail("thread_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                  ,0x8a,"struct thread_pool *new_thread_pool(size_t)");
  }
  thread_pool = (thread_pool *)xmalloc(0xd8);
  pcVar1 = &(thread_pool->queue).avail_cond;
  iVar3 = cnd_init(pcVar1);
  if (iVar3 == 0) {
    pcVar2 = &(thread_pool->queue).done_cond;
    iVar3 = cnd_init(pcVar2);
    if (iVar3 == 0) {
      iVar3 = mtx_init(&(thread_pool->queue).mutex,0);
      if (iVar3 == 0) {
        queue = &thread_pool->queue;
        (thread_pool->queue).done_target = 0;
        (thread_pool->queue).worked_on = 0;
        (thread_pool->queue).done_items = (work_item *)0x0;
        (thread_pool->queue).done_count = 0;
        queue->first_item = (work_item *)0x0;
        (thread_pool->queue).last_item = (work_item *)0x0;
        ptVar4 = (thread_data *)xmalloc(thread_count * 0x18);
        thread_pool->thread_data = ptVar4;
        ptVar5 = (thrd_t *)xmalloc(thread_count * 8);
        thread_pool->threads = ptVar5;
        thread_pool->thread_count = thread_count;
        thread_pool->should_stop = false;
        lVar8 = 0;
        lVar7 = 0;
        sVar6 = 0;
        while( true ) {
          if (thread_count == sVar6) {
            return thread_pool;
          }
          ptVar4 = thread_pool->thread_data;
          *(thread_pool **)((long)&ptVar4->thread_pool + lVar7) = thread_pool;
          *(work_queue **)((long)&ptVar4->queue + lVar7) = queue;
          *(size_t *)((long)&ptVar4->thread_id + lVar7) = sVar6;
          iVar3 = thrd_create((long)thread_pool->threads + lVar8,thread_pool_worker,
                              (long)&ptVar4->thread_pool + lVar7);
          if (iVar3 != 0) break;
          sVar6 = sVar6 + 1;
          lVar7 = lVar7 + 0x18;
          lVar8 = lVar8 + 8;
        }
        thread_pool->thread_count = sVar6;
        terminate_threads(thread_pool);
        free_work_queue(queue);
        free(thread_pool->threads);
        free(thread_pool->thread_data);
        goto LAB_001092d1;
      }
      cnd_destroy(pcVar2);
    }
    cnd_destroy(pcVar1);
  }
LAB_001092d1:
  free(thread_pool);
  return (thread_pool *)0x0;
}

Assistant:

struct thread_pool* new_thread_pool(size_t thread_count) {
    assert(thread_count > 0);
    struct thread_pool* thread_pool = xmalloc(sizeof(struct thread_pool));
    if (!init_work_queue(&thread_pool->queue))
        goto cleanup_queue;
    thread_pool->thread_data = xmalloc(sizeof(struct thread_data) * thread_count);
    thread_pool->threads = xmalloc(sizeof(thrd_t) * thread_count);
    thread_pool->thread_count = thread_count;
    thread_pool->should_stop = false;
    for (size_t i = 0; i < thread_count; ++i) {
        thread_pool->thread_data[i].thread_pool = thread_pool;
        thread_pool->thread_data[i].queue = &thread_pool->queue;
        thread_pool->thread_data[i].thread_id = i;
        if (thrd_create(thread_pool->threads + i, thread_pool_worker, &thread_pool->thread_data[i]) != thrd_success) {
            thread_pool->thread_count = i;
            goto cleanup_thread;
        }
    }
    return thread_pool;
cleanup_thread:
    terminate_threads(thread_pool);
    free_work_queue(&thread_pool->queue);
    free(thread_pool->threads);
    free(thread_pool->thread_data);
cleanup_queue:
    free(thread_pool);
    return NULL;
}